

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O3

LineInterpolationMethod
tcu::verifyLineGroupInterpolation
          (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  float *pfVar1;
  Vec4 *pVVar2;
  Vec4 *pVVar3;
  ChannelOrder CVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  RasterizationArguments *pRVar8;
  bool bVar9;
  int i_6;
  long lVar10;
  Surface *pSVar11;
  long lVar12;
  pointer pSVar13;
  ostream *poVar14;
  char *pcVar15;
  ulong uVar16;
  pointer pSVar17;
  bool bVar18;
  uint uVar19;
  SingleSampleWideLineCandidate *extraout_RDX;
  SingleSampleWideLineCandidate *extraout_RDX_00;
  SingleSampleWideLineCandidate *extraout_RDX_01;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int dy;
  int iVar20;
  allocator_type *paVar21;
  allocator_type *paVar22;
  ChannelOrder CVar23;
  allocator_type *paVar24;
  allocator_type *paVar25;
  int __fd;
  uint uVar26;
  ulong uVar27;
  allocator_type *paVar28;
  allocator_type *paVar29;
  allocator_type *paVar30;
  allocator_type *paVar31;
  allocator_type *paVar32;
  allocator_type *paVar33;
  uint uVar34;
  int iVar35;
  allocator_type *paVar36;
  allocator_type *paVar37;
  uint uVar38;
  ulong uVar39;
  allocator_type *paVar40;
  allocator_type *paVar41;
  allocator_type *paVar42;
  int iVar43;
  allocator_type *paVar44;
  allocator_type *paVar45;
  uint uVar46;
  float fVar47;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  IVec3 formatLimit;
  int numRasterized;
  Vector<int,_3> res_1;
  IVec3 pixelNativeColor;
  Surface errorMask;
  IVec2 viewportSize;
  Vector<float,_3> res_7;
  Vector<float,_3> res_6;
  Vector<float,_3> res_4;
  Vector<float,_3> res_5;
  Vector<float,_3> res_2;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> effectiveLines;
  Vector<float,_3> res_3;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> screenspaceLines;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rootPixelLocation;
  LineExitDiamondGenerator diamondGenerator;
  TextureLevel referenceLineMap;
  allocator_type *local_5f8;
  allocator_type *local_5f0;
  int local_5e4;
  long local_5e0;
  allocator_type *local_5d0;
  undefined1 local_5b8 [8];
  ChannelOrder local_5b0;
  ChannelType CStack_5ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  ulong local_598;
  RasterizationArguments *local_590;
  allocator_type *local_588;
  allocator_type *local_580;
  string local_578;
  undefined8 local_558;
  float fStack_550;
  uint uStack_54c;
  Surface *local_548;
  int local_53c;
  undefined8 local_538;
  int iStack_530;
  int iStack_52c;
  undefined8 local_528;
  string local_518;
  undefined1 local_4f8 [8];
  TextureFormat local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  _Alloc_hider local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  undefined8 local_4b8;
  uint uStack_4b0;
  uint uStack_4ac;
  ulong local_4a0;
  undefined8 local_498;
  float fStack_490;
  float fStack_48c;
  undefined8 local_488;
  float fStack_480;
  float fStack_47c;
  undefined8 local_478;
  Surface local_468;
  allocator_type *local_450;
  IVec2 local_448;
  Vector<float,_3> local_440;
  Vector<float,_3> local_430;
  undefined8 local_420;
  undefined4 local_418;
  Vector<float,_3> local_410;
  undefined8 local_400;
  undefined4 local_3f8;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_3f0;
  string local_3d8;
  undefined1 local_3b8 [8];
  undefined1 local_3b0 [24];
  _Alloc_hider local_398;
  long lStack_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  long alStack_378 [2];
  undefined4 auStack_368 [10];
  ios_base local_340 [264];
  string local_238;
  string local_218;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  ulong local_1d8;
  ulong local_1d0;
  allocator_type *local_1c8;
  allocator_type *local_1c0;
  allocator_type *local_1b8;
  allocator_type *local_1b0;
  allocator_type *local_1a8;
  undefined8 local_1a0;
  undefined4 local_198;
  undefined8 local_190;
  undefined4 local_188;
  undefined8 local_180;
  undefined4 local_178;
  undefined8 local_170;
  undefined4 local_168;
  undefined8 local_160;
  undefined4 local_158;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_150;
  undefined1 local_138 [8];
  undefined8 uStack_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108 [6];
  vector<bool,_std::allocator<bool>_> local_a8;
  TextureLevel local_80;
  PixelBufferAccess local_58;
  SingleSampleWideLineCandidate *__args;
  
  if (args->numSamples != 0) {
    bVar9 = anon_unknown_3::verifyMultisampleLineGroupInterpolation(surface,scene,args,log);
    return (uint)!bVar9 * 2;
  }
  local_590 = args;
  if ((scene->lineWidth == 1.0) && (!NAN(scene->lineWidth))) {
    bVar9 = anon_unknown_3::verifyLineGroupPixelIndependentInterpolation
                      (surface,scene,args,log,LINEINTERPOLATION_STRICTLY_CORRECT);
    if (bVar9) {
      return LINEINTERPOLATION_STRICTLY_CORRECT;
    }
    goto LAB_019dd51d;
  }
  local_448.m_data[0] = surface->m_width;
  local_448.m_data[1] = surface->m_height;
  Surface::Surface(&local_468,local_448.m_data[0],local_448.m_data[1]);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_3f0,
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_3b8);
  local_3b8 = (undefined1  [8])((ulong)local_3b8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_a8,
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(bool *)local_3b8,
             (allocator_type *)local_138);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_150,
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(scene->lines).
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_3b8);
  local_3b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,"Verifying rasterization result. Native format is RGB",0x34);
  pRVar8 = local_590;
  std::ostream::operator<<((ostringstream *)local_3b0,local_590->redBits);
  std::ostream::operator<<((ostringstream *)local_3b0,pRVar8->greenBits);
  std::ostream::operator<<((ostringstream *)local_3b0,pRVar8->blueBits);
  MessageBuilder::operator<<((MessageBuilder *)local_3b8,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  if ((8 < pRVar8->redBits) || ((8 < pRVar8->greenBits || (8 < pRVar8->blueBits)))) {
    local_3b8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,
               "Warning! More than 8 bits in a color channel, this may produce false negatives.",
               0x4f);
    MessageBuilder::operator<<((MessageBuilder *)local_3b8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
  }
  local_3b8._0_4_ = R;
  local_3b8._4_4_ = UNSIGNED_INT8;
  TextureLevel::TextureLevel
            (&local_80,(TextureFormat *)local_3b8,surface->m_width,surface->m_height,1);
  TextureLevel::getAccess((PixelBufferAccess *)local_3b8,&local_80);
  local_138._0_4_ = R;
  local_138._4_4_ = SNORM_INT8;
  uStack_130 = 0;
  clear((PixelBufferAccess *)local_3b8,(IVec4 *)local_138);
  local_138._0_4_ = RGBA;
  local_138._4_4_ = UNORM_INT8;
  if ((void *)local_468.m_pixels.m_cap != (void *)0x0) {
    local_468.m_pixels.m_cap = (size_t)local_468.m_pixels.m_ptr;
  }
  PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_3b8,(TextureFormat *)local_138,local_468.m_width,
             local_468.m_height,1,(void *)local_468.m_pixels.m_cap);
  local_138._0_4_ = R;
  local_138._4_4_ = SNORM_INT8;
  uStack_130 = 0x3f80000000000000;
  clear((PixelBufferAccess *)local_3b8,(Vec4 *)local_138);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_3b8,
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_138);
  anon_unknown_3::genScreenSpaceLines
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_3b8,
             &scene->lines,&local_448);
  fVar47 = scene->lineWidth;
  TextureLevel::getAccess(&local_58,&local_80);
  anon_unknown_3::setMaskMapCoverageBitForLines
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_3b8,
             fVar47,&local_58);
  pSVar13 = (scene->lines).
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar17 = (scene->lines).
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pSVar17 - (long)pSVar13) >> 6)) {
    lVar10 = 0;
    uVar16 = 0;
    do {
      pfVar1 = (float *)((long)local_3b8 + lVar10);
      fVar47 = *pfVar1;
      fVar49 = pfVar1[1];
      fVar50 = pfVar1[2];
      fVar52 = pfVar1[3];
      fVar48 = fVar50 - fVar47;
      fVar51 = fVar52 - fVar49;
      auVar54._0_8_ = CONCAT44(fVar51,fVar48) ^ 0x8000000080000000;
      auVar54._8_4_ = -(fVar50 - fVar50);
      auVar54._12_4_ = -(fVar52 - fVar52);
      auVar55._4_4_ = fVar51;
      auVar55._0_4_ = fVar48;
      auVar55._8_4_ = fVar50 - fVar50;
      auVar55._12_4_ = fVar52 - fVar52;
      auVar55 = maxps(auVar54,auVar55);
      uVar27 = 1L << ((byte)uVar16 & 0x3f);
      uVar39 = uVar16 >> 6 & 0x3ffffff;
      if (auVar55._4_4_ <= auVar55._0_4_) {
        uVar27 = uVar27 | local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar39];
        fVar48 = 0.0;
        fVar51 = -1.0;
      }
      else {
        uVar27 = ~uVar27 & local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar39];
        fVar48 = -1.0;
        fVar51 = 0.0;
      }
      local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar39] = uVar27;
      fVar53 = (scene->lineWidth + -1.0) * 0.5;
      pfVar1 = (float *)((long)(local_3f0.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10);
      *pfVar1 = fVar47 + fVar48 * fVar53;
      pfVar1[1] = fVar49 + fVar51 * fVar53;
      pfVar1[2] = fVar50 + fVar48 * fVar53;
      pfVar1[3] = fVar52 + fVar51 * fVar53;
      uVar16 = uVar16 + 1;
      pSVar13 = (scene->lines).
                super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar17 = (scene->lines).
                super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar10 = lVar10 + 0x10;
    } while ((long)uVar16 < (long)(int)((ulong)((long)pSVar17 - (long)pSVar13) >> 6));
  }
  if ((TextureFormat)local_3b8 != (TextureFormat)0x0) {
    operator_delete((void *)local_3b8,local_3b0._8_8_ - (long)local_3b8);
    pSVar13 = (scene->lines).
              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = (scene->lines).
              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (0 < (int)((ulong)((long)pSVar17 - (long)pSVar13) >> 6)) {
    uVar16 = 0;
    local_548 = (Surface *)&surface->m_height;
    do {
      uVar39 = 1L << ((byte)uVar16 & 0x3f) &
               local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar16 >> 6 & 0x3ffffff];
      pSVar11 = local_548;
      if (uVar39 != 0) {
        pSVar11 = surface;
      }
      iVar20 = pSVar11->m_width;
      rr::LineExitDiamondGenerator::LineExitDiamondGenerator((LineExitDiamondGenerator *)local_138);
      memset((LineExitDiamond *)local_3b8,0,0x100);
      lVar12 = (ulong)(uVar39 == 0) * 4;
      lVar10 = (ulong)(uVar39 != 0) * 4;
      local_578._M_dataplus._M_p._0_4_ = 0x20;
      local_4f8 = (undefined1  [8])
                  *(pointer *)
                   local_3f0.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar16].m_data;
      local_5b8._0_4_ =
           (undefined4)
           *(undefined8 *)
            (local_3f0.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar16].m_data + 2);
      local_5b8._4_4_ =
           (undefined4)
           ((ulong)*(undefined8 *)
                    (local_3f0.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].m_data + 2) >> 0x20);
      fVar47 = (-1.0 - *(float *)(local_4f8 + lVar12)) *
               ((*(float *)(local_5b8 + lVar10) - *(float *)(local_4f8 + lVar10)) /
               (*(float *)(local_5b8 + lVar12) - *(float *)(local_4f8 + lVar12))) +
               *(float *)(local_4f8 + lVar10);
      if (uVar39 != 0) {
        fVar50 = -1.0;
        fVar49 = fVar47;
      }
      else {
        fVar49 = -1.0;
        fVar50 = fVar47;
      }
      fVar47 = (float)iVar20 + 1.0;
      local_5b8._4_4_ =
           (fVar47 - *(float *)(local_4f8 + lVar12)) *
           ((*(float *)(local_5b8 + lVar10) - *(float *)(local_4f8 + lVar10)) /
           (*(float *)(local_5b8 + lVar12) - *(float *)(local_4f8 + lVar12))) +
           *(float *)(local_4f8 + lVar10);
      local_5b8._0_4_ = fVar47;
      if (uVar39 == 0) {
        local_5b8._0_4_ = local_5b8._4_4_;
        local_5b8._4_4_ = fVar47;
      }
      local_4f0.order = R;
      local_4f0.type = 0x3f800000;
      local_5b0 = R;
      CStack_5ac = 0x3f800000;
      local_4f8._0_4_ = fVar50;
      local_4f8._4_4_ = fVar49;
      rr::LineExitDiamondGenerator::init
                ((LineExitDiamondGenerator *)local_138,(EVP_PKEY_CTX *)local_4f8);
      local_4f8._0_4_ = 0x10000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (local_150.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar16,(long)iVar20,
                 (value_type_conflict4 *)local_4f8);
      while ((int)local_578._M_dataplus._M_p == 0x20) {
        rr::LineExitDiamondGenerator::rasterize
                  ((LineExitDiamondGenerator *)local_138,(LineExitDiamond *)local_3b8,0x20,
                   (int *)&local_578);
        if ((int)local_578._M_dataplus._M_p < 1) break;
        lVar10 = 0;
        do {
          uVar19 = *(uint *)(local_3b0 + lVar10 * 8 + -4);
          if (uVar39 != 0) {
            uVar19 = *(uint *)(local_3b0 + lVar10 * 8 + -8);
          }
          if ((int)uVar19 < iVar20 && -1 < (int)uVar19) {
            uVar46 = *(uint *)(local_3b0 + lVar10 * 8 + -8);
            if (uVar39 != 0) {
              uVar46 = *(uint *)(local_3b0 + lVar10 * 8 + -4);
            }
            local_150.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar16].
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar19] = uVar46 & 0xffff;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)local_578._M_dataplus._M_p);
      }
      rr::LineExitDiamondGenerator::~LineExitDiamondGenerator((LineExitDiamondGenerator *)local_138)
      ;
      uVar16 = uVar16 + 1;
    } while ((long)uVar16 <
             (long)(int)((ulong)((long)(scene->lines).
                                       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(scene->lines).
                                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 6));
  }
  iVar20 = surface->m_height;
  __fd = (int)log;
  if (iVar20 + -1 < 2) {
LAB_019dd1e3:
    local_3b8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"No invalid pixels found.",0x18);
    MessageBuilder::operator<<((MessageBuilder *)local_3b8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
    local_3b8._0_4_ = S;
    local_3b8._4_4_ = SNORM_INT8;
    local_4f8 = (undefined1  [8])&local_4e8;
    local_4f8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_4f8,(ulong)local_3b8);
    local_4e8._M_allocated_capacity = (size_type)local_3b8;
    *(undefined8 *)local_4f8 = 0x6163696669726556;
    *(char *)((long)local_4f8 + 8) = 't';
    *(char *)((long)local_4f8 + 9) = 'i';
    *(char *)((long)local_4f8 + 10) = 'o';
    *(char *)((long)local_4f8 + 0xb) = 'n';
    *(char *)((long)local_4f8 + 0xc) = ' ';
    *(char *)((long)local_4f8 + 0xd) = 'r';
    *(char *)((long)local_4f8 + 0xe) = 'e';
    *(char *)((long)local_4f8 + 0xf) = 's';
    *(char *)((long)local_4f8 + 0xf) = 's';
    *(char *)((long)local_4f8 + 0x10) = 'u';
    *(char *)((long)local_4f8 + 0x11) = 'l';
    *(char *)((long)local_4f8 + 0x12) = 't';
    local_4f0.order = local_3b8._0_4_;
    local_4f0.type = local_3b8._4_4_;
    *(char *)((long)local_4f8 + (long)local_3b8) = '\0';
    local_3b8._0_4_ = S;
    local_3b8._4_4_ = SNORM_INT8;
    local_5b8 = (undefined1  [8])&local_5a8;
    pcVar15 = (char *)std::__cxx11::string::_M_create((ulong *)local_5b8,(ulong)local_3b8);
    local_5b8._0_4_ = SUB84(pcVar15,0);
    local_5b8._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
    local_5a8._M_allocated_capacity = (size_type)local_3b8;
    builtin_strncpy(pcVar15,"Result of rendering",0x13);
    local_5b0 = local_3b8._0_4_;
    CStack_5ac = local_3b8._4_4_;
    pcVar15[(long)local_3b8] = '\0';
    LogImageSet::LogImageSet((LogImageSet *)local_138,(string *)local_4f8,(string *)local_5b8);
    TestLog::startImageSet(log,(char *)local_138,local_118._M_p);
    local_578.field_2._M_allocated_capacity._0_4_ = 0x75736552;
    local_578.field_2._M_allocated_capacity._4_2_ = 0x746c;
    local_578._M_string_length = 6;
    local_578.field_2._M_local_buf[6] = '\0';
    local_518.field_2._M_allocated_capacity._0_4_ = 0x75736552;
    local_518.field_2._M_allocated_capacity._4_2_ = 0x746c;
    local_518._M_string_length = 6;
    local_518.field_2._M_local_buf[6] = '\0';
    pSVar11 = surface;
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
    LogImage::LogImage((LogImage *)local_3b8,&local_578,&local_518,surface,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_3b8,__fd,__buf_01,(size_t)pSVar11);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_p != &local_388) {
      operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
    }
    if (local_3b8 != (undefined1  [8])((long)local_3b0 + 8)) {
      operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,
                      CONCAT17(local_518.field_2._M_local_buf[7],
                               CONCAT16(local_518.field_2._M_local_buf[6],
                                        CONCAT24(local_518.field_2._M_allocated_capacity._4_2_,
                                                 local_518.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,
                      CONCAT17(local_578.field_2._M_local_buf[7],
                               CONCAT16(local_578.field_2._M_local_buf[6],
                                        CONCAT24(local_578.field_2._M_allocated_capacity._4_2_,
                                                 local_578.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_p != local_108) {
      operator_delete(local_118._M_p,local_108[0]._M_allocated_capacity + 1);
    }
    if (local_138 != (undefined1  [8])&local_128) {
      operator_delete((void *)local_138,local_128._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_) != &local_5a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_5b8._4_4_,local_5b8._0_4_),
                      (ulong)(local_5a8._M_allocated_capacity + 1));
    }
    if (local_4f8 != (undefined1  [8])&local_4e8) {
      operator_delete((void *)local_4f8,(ulong)(local_4e8._M_allocated_capacity + 1));
    }
    bVar9 = true;
  }
  else {
    iVar35 = surface->m_width;
    local_598 = 1;
    local_5e4 = 0;
    local_53c = 0;
    do {
      if (1 < iVar35 + -1) {
        uVar19 = 1;
        local_548 = (Surface *)0x0;
        do {
          pRVar8 = local_590;
          uVar46 = *(uint *)((long)(surface->m_pixels).m_ptr +
                            (long)(int)(iVar35 * (int)local_598 + uVar19) * 4);
          anon_unknown_3::convertRGB8ToNativeFormat
                    ((anon_unknown_3 *)local_4f8,(RGBA *)(ulong)uVar46,local_590);
          iVar20 = -1;
          local_5b8._0_4_ = ~(-1 << ((byte)pRVar8->redBits & 0x1f));
          local_5b8._4_4_ = ~(-1 << ((byte)pRVar8->greenBits & 0x1f));
          local_5b0 = ~(-1 << ((byte)pRVar8->blueBits & 0x1f));
          CVar23 = 0xffff;
          CVar4 = R;
          do {
            iVar35 = (int)local_598;
            iVar43 = 0;
            do {
              TextureLevel::getAccess((PixelBufferAccess *)local_3b8,&local_80);
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_138,(int)(PixelBufferAccess *)local_3b8,
                         (int)local_548 + iVar43,iVar20 + iVar35);
              CVar4 = CVar4 | local_138._0_4_;
              CVar23 = CVar23 & local_138._0_4_;
              iVar43 = iVar43 + 1;
            } while (iVar43 != 3);
            iVar20 = iVar20 + 1;
          } while (iVar20 != 2);
          if ((((CVar23 != R) ||
               (1 << (8U - (char)local_590->redBits & 0x1f) < (int)(uVar46 & 0xff))) ||
              (1 << (8U - (char)local_590->greenBits & 0x1f) < (int)(uVar46 >> 8 & 0xff))) ||
             (1 << (8U - (char)local_590->blueBits & 0x1f) < (int)(uVar46 >> 0x10 & 0xff))) {
            pSVar13 = (scene->lines).
                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pSVar17 = (scene->lines).
                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if ((int)((ulong)((long)pSVar17 - (long)pSVar13) >> 6) < 1) {
              local_5d0 = (allocator_type *)0x0;
              local_5f8 = (allocator_type *)0x0;
              local_5f0 = (allocator_type *)0x0;
            }
            else {
              uVar16 = 0;
              local_5f0 = (allocator_type *)0x0;
              local_5f8 = (allocator_type *)0x0;
              local_5d0 = (allocator_type *)0x0;
              do {
                uVar39 = uVar16;
                if ((CVar4 >> ((uint)uVar16 & 0x1f) & 1) != 0) {
                  local_580 = (allocator_type *)
                              CONCAT44(local_580._4_4_,
                                       *(float *)((long)pSVar13[uVar16].positions[0].m_data + 0xc));
                  local_588 = (allocator_type *)
                              CONCAT44(local_588._4_4_,
                                       *(float *)((long)(pSVar13[uVar16].positions + 1) + 0xc));
                  local_578._M_dataplus._M_p =
                       *(pointer *)
                        local_3f0.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar16].m_data;
                  local_518._M_dataplus._M_p =
                       *(pointer *)
                        (local_3f0.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16].m_data + 2);
                  bVar9 = (local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [uVar16 >> 6 & 0x3ffffff] & 1L << ((byte)uVar16 & 0x3f)) == 0;
                  uVar26 = (uint)local_598;
                  uVar39 = (ulong)uVar19;
                  if (bVar9) {
                    uVar39 = local_598 & 0xffffffff;
                  }
                  uVar34 = (uint)(short)local_150.
                                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar39];
                  uVar38 = uVar34;
                  if (!bVar9) {
                    uVar38 = uVar19;
                    uVar26 = uVar34;
                  }
                  memset(local_3b0,0,0xf0);
                  local_1e8._0_4_ = (float)(int)local_5b8._0_4_;
                  local_3b8 = (undefined1  [8])(uVar16 & 0xffffffff);
                  local_1f8 = (float)(int)local_5b8._4_4_;
                  fStack_1f4 = (float)(int)local_5b0;
                  fStack_1f0 = 0.0;
                  fStack_1ec = 0.0;
                  local_1e8._4_4_ = local_1f8;
                  local_1e8._8_4_ = fStack_1f4;
                  local_1e8._12_4_ = local_1e8._0_4_;
                  iVar35 = uVar26 - !bVar9;
                  uVar38 = uVar38 - bVar9;
                  iVar20 = 3;
                  __args = extraout_RDX;
                  local_4a0 = uVar16;
                  do {
                    bVar18 = surface->m_width <= (int)uVar38 || (int)uVar38 < 0;
                    __args = (SingleSampleWideLineCandidate *)
                             CONCAT71((int7)((ulong)__args >> 8),bVar18);
                    if (((bVar18) || (iVar35 < 0)) ||
                       ((surface->m_height <= iVar35 ||
                        ((*(uint *)((long)(surface->m_pixels).m_ptr +
                                   (long)(int)(surface->m_width * iVar35 + uVar38) * 4) & 0xffffff)
                         != 0)))) {
                      (anonymous_namespace)::
                      calcSingleSampleLineInterpolationRangeWithWeightEquation<tcu::(anonymous_namespace)::LineInterpolationRange(*)(tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&)>
                                ((_anonymous_namespace_ *)local_138,(Vec2 *)&local_578,
                                 local_580._0_4_,(Vec2 *)&local_518,local_588._0_4_,
                                 (IVec2 *)(ulong)uVar38,iVar35,
                                 (_func_LineInterpolationRange_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr
                                  *)(ulong)(uint)local_590->subpixelBits);
                      pSVar13 = (scene->lines).
                                super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      fVar47 = 1.0;
                      if ((float)uStack_130 <= 1.0) {
                        fVar47 = (float)uStack_130;
                      }
                      fVar47 = (float)(~-(uint)((float)uStack_130 < 0.0) & (uint)fVar47);
                      pVVar2 = pSVar13[uVar16].colors;
                      pVVar3 = pSVar13[uVar16].colors + 1;
                      fVar49 = 1.0;
                      if (uStack_130._4_4_ <= 1.0) {
                        fVar49 = uStack_130._4_4_;
                      }
                      fVar49 = (float)(~-(uint)(uStack_130._4_4_ < 0.0) & (uint)fVar49);
                      fVar50 = fVar49 * pVVar3->m_data[0] + fVar47 * pVVar2->m_data[0];
                      fVar52 = fVar49 * pVVar3->m_data[1] + fVar47 * pVVar2->m_data[1];
                      fStack_480 = fVar49 * pVVar3->m_data[2] + fVar47 * pVVar2->m_data[2];
                      fVar47 = 1.0;
                      if ((float)local_138._0_4_ <= 1.0) {
                        fVar47 = (float)local_138._0_4_;
                      }
                      fVar47 = (float)(~-(uint)((float)local_138._0_4_ < 0.0) & (uint)fVar47);
                      fVar49 = 1.0;
                      if ((float)local_138._4_4_ <= 1.0) {
                        fVar49 = (float)local_138._4_4_;
                      }
                      fVar49 = (float)(~-(uint)((float)local_138._4_4_ < 0.0) & (uint)fVar49);
                      fStack_47c = fVar49 * pVVar3->m_data[0] + fVar47 * pVVar2->m_data[0];
                      fVar48 = fVar49 * pVVar3->m_data[1] + fVar47 * pVVar2->m_data[1];
                      fStack_490 = fVar49 * pVVar3->m_data[2] + fVar47 * pVVar2->m_data[2];
                      fStack_48c = fVar49 * pVVar3->m_data[3] + fVar47 * pVVar2->m_data[3];
                      local_488 = (allocator_type *)CONCAT44(fVar52,fVar50);
                      fVar50 = fVar50 * local_1e8._0_4_;
                      fVar52 = fVar52 * local_1e8._4_4_;
                      fVar47 = fStack_480 * local_1e8._8_4_;
                      fVar49 = fStack_47c * local_1e8._12_4_;
                      auVar5._4_4_ = fVar52;
                      auVar5._0_4_ = fVar50;
                      auVar5._8_4_ = fVar47;
                      auVar5._12_4_ = fVar49;
                      auVar55 = minps(local_1e8,auVar5);
                      fStack_550 = (float)(-(uint)(0.0 <= fVar47) & auVar55._8_4_);
                      uStack_54c = -(uint)(0.0 <= fVar49) & auVar55._12_4_;
                      local_558 = (allocator_type *)
                                  CONCAT44(-(uint)(0.0 <= fVar52) & auVar55._4_4_,
                                           -(uint)(0.0 <= fVar50) & auVar55._0_4_);
                      local_498 = (allocator_type *)CONCAT44(fStack_490,fVar48);
                      auVar7._4_4_ = fStack_1f4;
                      auVar7._0_4_ = local_1f8;
                      auVar7._8_4_ = fStack_1f0;
                      auVar7._12_4_ = fStack_1ec;
                      auVar56._0_4_ = fVar48 * local_1f8;
                      auVar56._4_4_ = fStack_490 * fStack_1f4;
                      auVar56._8_4_ = fStack_490 * fStack_1f0;
                      auVar56._12_4_ = fStack_48c * fStack_1ec;
                      auVar55 = minps(auVar7,auVar56);
                      uStack_4b0 = -(uint)(0.0 <= auVar56._8_4_) & auVar55._8_4_;
                      uStack_4ac = -(uint)(0.0 <= auVar56._12_4_) & auVar55._12_4_;
                      local_4b8 = (allocator_type *)
                                  CONCAT44(-(uint)(0.0 <= auVar56._4_4_) & auVar55._4_4_,
                                           -(uint)(0.0 <= auVar56._0_4_) & auVar55._0_4_);
                      fVar47 = floorf(fStack_550);
                      local_538._0_4_ = fVar47;
                      fVar47 = ceilf(local_558._4_4_);
                      local_528._0_4_ = fVar47;
                      fVar47 = floorf((float)local_558);
                      local_478 = (allocator_type *)CONCAT44(extraout_XMM0_Db,fVar47);
                      fVar47 = floorf(local_558._4_4_);
                      local_538._4_4_ = (uint)fVar47;
                      iStack_530 = (int)(float)local_538;
                      iStack_52c = (int)(float)local_528;
                      local_538._0_4_ = (float)(int)(float)local_478;
                      local_528._0_4_ = ceilf((float)local_4b8);
                      local_528._4_4_ = extraout_XMM0_Db_00;
                      fVar47 = ceilf(local_4b8._4_4_);
                      auVar6._8_4_ = iStack_530;
                      auVar6._0_8_ = local_538;
                      auVar6._12_4_ = iStack_52c;
                      __args = extraout_RDX_00;
                      if ((int)(float)local_538 <= (int)local_4f8._0_4_) {
                        __args = (SingleSampleWideLineCandidate *)(ulong)local_538._4_4_;
                        if ((int)local_538._4_4_ <= (int)local_4f8._4_4_) {
                          __args = (SingleSampleWideLineCandidate *)((ulong)local_4f0 & 0xffffffff);
                          if (((iStack_530 <= (int)local_4f0.order) &&
                              ((int)local_4f8._0_4_ <= iStack_52c)) &&
                             (((int)local_4f8._4_4_ <= (int)(float)local_528 &&
                              ((int)local_4f0.order <= (int)fVar47)))) goto LAB_019dcd71;
                        }
                      }
                      if (local_5e4 < 4) {
                        lVar10 = (long)(int)local_3b8._4_4_;
                        local_3b8._4_4_ = local_3b8._4_4_ + SNORM_INT16;
                        lVar12 = lVar10 * 0x50;
                        *(uint *)(local_3b0 + lVar12) = uVar38;
                        *(int *)(local_3b0 + lVar12 + 4) = iVar35;
                        *(undefined1 (*) [16])(local_3b0 + lVar12 + 8) = auVar6;
                        *(int *)&(&local_398)[lVar10 * 10]._M_p = (int)(float)local_528;
                        *(int *)((long)&(&local_398)[lVar10 * 10]._M_p + 4) = (int)fVar47;
                        (&lStack_390)[lVar10 * 10] = (long)local_558;
                        alStack_378[lVar10 * 10 + -2] = CONCAT44(uStack_54c,fStack_550);
                        alStack_378[lVar10 * 10 + -1] = (long)local_4b8;
                        alStack_378[lVar10 * 10] = (long)local_488;
                        alStack_378[lVar10 * 10 + 1] = CONCAT44(fStack_47c,fStack_480);
                        auStack_368[lVar10 * 0x14] = (undefined4)local_498;
                        auStack_368[lVar10 * 0x14 + 1] = local_498._4_4_;
                      }
                    }
                    uVar39 = local_4a0;
                    iVar35 = iVar35 + (uint)!bVar9;
                    uVar38 = uVar38 + bVar9;
                    iVar20 = iVar20 + -1;
                  } while (iVar20 != 0);
                  if ((local_5e4 < 4) && (0 < (int)local_3b8._4_4_)) {
                    if (local_5f8 == local_5d0) {
                      uVar16 = (long)local_5f8 - (long)local_5f0;
                      if (uVar16 == 0x7ffffffffffffff8) {
                        std::__throw_length_error("vector::_M_realloc_insert");
                      }
                      uVar27 = ((long)uVar16 >> 3) * -0x1084210842108421;
                      uVar39 = uVar27;
                      if (local_5f8 == local_5f0) {
                        uVar39 = 1;
                      }
                      local_1d0 = uVar39 + uVar27;
                      if (0x84210842108420 < local_1d0) {
                        local_1d0 = 0x84210842108421;
                      }
                      if (CARRY8(uVar39,uVar27)) {
                        local_1d0 = 0x84210842108421;
                      }
                      local_1d8 = uVar16;
                      if (local_1d0 == 0) {
                        paVar22 = (allocator_type *)0x0;
                      }
                      else {
                        paVar22 = (allocator_type *)operator_new(local_1d0 * 0xf8);
                        __args = extraout_RDX_01;
                      }
                      std::
                      allocator_traits<std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>>
                      ::
                      construct<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,tcu::(anonymous_namespace)::SingleSampleWideLineCandidate_const&>
                                (paVar22 + ((long)uVar16 >> 3) * 8,
                                 (SingleSampleWideLineCandidate *)local_3b8,__args);
                      paVar25 = paVar22;
                      if (local_5f8 != local_5f0) {
                        paVar37 = local_5f0 + 0x28;
                        paVar41 = paVar22 + 0x34;
                        paVar42 = local_5f0 + 0x34;
                        paVar45 = local_5f0;
                        paVar21 = local_5f0 + 0x40;
                        paVar24 = paVar22 + 0x1c;
                        paVar28 = paVar22 + 0x10;
                        paVar29 = local_5f0 + 0x4c;
                        paVar30 = local_5f0 + 0x1c;
                        paVar31 = paVar22 + 0x28;
                        paVar32 = paVar22 + 0x40;
                        paVar33 = paVar22 + 0x4c;
                        paVar36 = local_5f0 + 0x10;
                        do {
                          local_478 = paVar36;
                          local_1b8 = paVar33;
                          local_498 = paVar25;
                          local_1a8 = paVar32;
                          local_588 = paVar31;
                          local_580 = paVar30;
                          local_1c0 = paVar29;
                          local_528 = paVar28;
                          local_488 = paVar24;
                          local_1b0 = paVar21;
                          local_1c8 = paVar45;
                          *(undefined8 *)local_498 = *(undefined8 *)local_1c8;
                          local_538 = local_498 + 8;
                          local_558 = local_1c8 + 8;
                          local_1f8 = SUB84(paVar41,0);
                          fStack_1f4 = (float)((ulong)paVar41 >> 0x20);
                          local_1e8._0_8_ = paVar37;
                          paVar25 = (allocator_type *)0x0;
                          paVar45 = local_488;
                          paVar21 = local_528;
                          paVar24 = local_1c0;
                          paVar28 = local_580;
                          paVar29 = local_588;
                          paVar30 = paVar37;
                          paVar31 = paVar41;
                          paVar32 = paVar42;
                          paVar33 = local_1a8;
                          paVar36 = local_1b0;
                          paVar40 = local_1b8;
                          paVar44 = local_478;
                          do {
                            local_4b8 = paVar25;
                            lVar10 = (long)local_4b8 * 0x50;
                            *(undefined4 *)(local_538 + lVar10) =
                                 *(undefined4 *)(local_558 + lVar10);
                            *(undefined4 *)(local_498 + lVar10 + 0xc) =
                                 *(undefined4 *)(local_1c8 + lVar10 + 0xc);
                            lVar10 = 0;
                            do {
                              *(undefined4 *)(paVar21 + lVar10 * 4) =
                                   *(undefined4 *)(paVar44 + lVar10 * 4);
                              lVar10 = lVar10 + 1;
                            } while (lVar10 != 3);
                            lVar10 = 0;
                            do {
                              *(undefined4 *)(paVar45 + lVar10 * 4) =
                                   *(undefined4 *)(paVar28 + lVar10 * 4);
                              lVar10 = lVar10 + 1;
                            } while (lVar10 != 3);
                            lVar10 = 0;
                            do {
                              *(undefined4 *)(paVar29 + lVar10 * 4) =
                                   *(undefined4 *)(paVar30 + lVar10 * 4);
                              lVar10 = lVar10 + 1;
                            } while (lVar10 != 3);
                            lVar10 = 0;
                            do {
                              *(undefined4 *)(paVar31 + lVar10 * 4) =
                                   *(undefined4 *)(paVar32 + lVar10 * 4);
                              lVar10 = lVar10 + 1;
                            } while (lVar10 != 3);
                            lVar10 = 0;
                            do {
                              *(undefined4 *)(paVar33 + lVar10 * 4) =
                                   *(undefined4 *)(paVar36 + lVar10 * 4);
                              lVar10 = lVar10 + 1;
                            } while (lVar10 != 3);
                            lVar10 = 0;
                            do {
                              *(undefined4 *)(paVar40 + lVar10 * 4) =
                                   *(undefined4 *)(paVar24 + lVar10 * 4);
                              lVar10 = lVar10 + 1;
                            } while (lVar10 != 3);
                            paVar21 = paVar21 + 0x50;
                            paVar44 = paVar44 + 0x50;
                            paVar45 = paVar45 + 0x50;
                            paVar28 = paVar28 + 0x50;
                            paVar29 = paVar29 + 0x50;
                            paVar30 = paVar30 + 0x50;
                            paVar31 = paVar31 + 0x50;
                            paVar32 = paVar32 + 0x50;
                            paVar33 = paVar33 + 0x50;
                            paVar36 = paVar36 + 0x50;
                            paVar40 = paVar40 + 0x50;
                            paVar24 = paVar24 + 0x50;
                            paVar25 = local_4b8 + 1;
                          } while (local_4b8 + 1 != (allocator_type *)0x3);
                          paVar25 = local_498 + 0xf8;
                          paVar37 = paVar37 + 0xf8;
                          paVar41 = paVar41 + 0xf8;
                          paVar42 = paVar42 + 0xf8;
                          paVar45 = local_1c8 + 0xf8;
                          paVar21 = local_1b0 + 0xf8;
                          paVar24 = local_488 + 0xf8;
                          paVar28 = local_528 + 0xf8;
                          paVar29 = local_1c0 + 0xf8;
                          paVar30 = local_580 + 0xf8;
                          paVar31 = local_588 + 0xf8;
                          paVar32 = local_1a8 + 0xf8;
                          paVar33 = local_1b8 + 0xf8;
                          paVar36 = local_478 + 0xf8;
                        } while (local_1c8 + 0xf8 != local_5f8);
                      }
                      local_450 = paVar22;
                      if (local_5f0 != (allocator_type *)0x0) {
                        operator_delete(local_5f0,local_1d8);
                      }
                      local_5f8 = paVar25 + 0xf8;
                      local_5d0 = local_450 + local_1d0 * 0xf8;
                      local_5f0 = local_450;
                      uVar39 = local_4a0;
                    }
                    else {
                      std::
                      allocator_traits<std::allocator<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate>>
                      ::
                      construct<tcu::(anonymous_namespace)::SingleSampleWideLineCandidate,tcu::(anonymous_namespace)::SingleSampleWideLineCandidate_const&>
                                (local_5f8,(SingleSampleWideLineCandidate *)local_3b8,__args);
                      local_5f8 = local_5f8 + 0xf8;
                    }
                  }
                  pSVar13 = (scene->lines).
                            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pSVar17 = (scene->lines).
                            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                uVar16 = uVar39 + 1;
              } while ((long)uVar16 < (long)(int)((ulong)((long)pSVar17 - (long)pSVar13) >> 6));
            }
            local_53c = local_53c + 1;
            *(undefined4 *)
             ((long)local_468.m_pixels.m_ptr +
             (long)(int)(local_468.m_width * (int)local_598 + uVar19) * 4) = 0xff0000ff;
            local_5e4 = local_5e4 + 1;
            if (local_5e4 < 4) {
              local_3b8 = (undefined1  [8])log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,"Found an invalid pixel at (",0x1b);
              std::ostream::operator<<((ostringstream *)local_3b0,uVar19);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,",",1);
              std::ostream::operator<<((ostringstream *)local_3b0,(int)local_598);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"), ",3);
              uVar26 = (int)((long)local_5f8 - (long)local_5f0 >> 3) * -0x42108421;
              std::ostream::operator<<((ostringstream *)local_3b0,uVar26);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0," candidate reference value(s) found:\n",0x25);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,"\tPixel color:\t\t",0xf);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"RGBA(",5);
              poVar14 = (ostream *)
                        std::ostream::operator<<((ostringstream *)local_3b0,uVar46 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
              poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar46 >> 8 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
              poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar46 >> 0x10 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
              poVar14 = (ostream *)std::ostream::operator<<(poVar14,uVar46 >> 0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,"\tNative color:\t\t",0x10);
              operator<<((ostream *)local_3b0,(Vector<int,_3> *)local_4f8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"\n",1);
              if (0 < (int)uVar26) {
                local_528 = local_5f0 + 0x10;
                local_478 = local_5f0 + 0x1c;
                local_488 = local_5f0 + 0x28;
                local_498 = local_5f0 + 0x34;
                local_580 = local_5f0 + 0x40;
                local_588 = local_5f0 + 0x4c;
                local_538 = (allocator_type *)0x0;
                do {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3b0,"\tCandidate line (line ",0x16);
                  local_558 = local_5f0 + (long)local_538 * 0xf8;
                  std::ostream::operator<<((ostream *)local_3b0,*(int *)local_558);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"):\n",3);
                  if (0 < *(int *)(local_558 + 4)) {
                    local_4b8 = local_558 + 8;
                    local_5e0 = 0;
                    paVar22 = local_478;
                    paVar25 = local_488;
                    paVar37 = local_580;
                    paVar41 = local_528;
                    paVar42 = local_588;
                    paVar45 = local_498;
                    do {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"\t\tCandidate interpolation point (index ",
                                 0x27);
                      std::ostream::operator<<(local_3b0,(int)local_5e0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"):\n",3);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,
                                 "\t\t\tRoot fragment position (non-replicated fragment): ",0x35);
                      operator<<((ostream *)local_3b0,
                                 (Vector<int,_2> *)(local_4b8 + local_5e0 * 0x50));
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,":\n",2);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"\t\t\tReference native color min: ",0x1f);
                      local_578._M_dataplus._M_p = (pointer)0x0;
                      local_578._M_string_length = local_578._M_string_length & 0xffffffff00000000;
                      uStack_130 = uStack_130 & 0xffffffff00000000;
                      local_138._0_4_ = R;
                      local_138._4_4_ = SNORM_INT8;
                      lVar10 = 0;
                      do {
                        iVar20 = *(int *)(paVar41 + lVar10 * 4);
                        iVar35 = *(int *)(local_5b8 + lVar10 * 4);
                        if (iVar20 < *(int *)(local_5b8 + lVar10 * 4)) {
                          iVar35 = iVar20;
                        }
                        iVar43 = *(int *)((long)&local_578._M_dataplus._M_p + lVar10 * 4);
                        if (iVar20 < iVar43) {
                          iVar35 = iVar43;
                        }
                        *(int *)(local_138 + lVar10 * 4) = iVar35;
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      operator<<((ostream *)local_3b0,(Vector<int,_3> *)local_138);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"\t\t\tReference native color max: ",0x1f);
                      local_218._M_dataplus._M_p = (pointer)0x0;
                      local_218._M_string_length = local_218._M_string_length & 0xffffffff00000000;
                      local_518._M_string_length = local_518._M_string_length & 0xffffffff00000000;
                      local_518._M_dataplus._M_p = (pointer)0x0;
                      lVar10 = 0;
                      do {
                        iVar20 = *(int *)(paVar22 + lVar10 * 4);
                        iVar35 = *(int *)(local_5b8 + lVar10 * 4);
                        if (iVar20 < *(int *)(local_5b8 + lVar10 * 4)) {
                          iVar35 = iVar20;
                        }
                        iVar43 = *(int *)((long)&local_218._M_dataplus._M_p + lVar10 * 4);
                        if (iVar20 < iVar43) {
                          iVar35 = iVar43;
                        }
                        *(int *)((long)&local_518._M_dataplus._M_p + lVar10 * 4) = iVar35;
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      operator<<((ostream *)local_3b0,(Vector<int,_3> *)&local_518);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"\t\t\tReference native float min: ",0x1f);
                      local_238._M_dataplus._M_p = (pointer)0x0;
                      local_238._M_string_length = local_238._M_string_length & 0xffffffff00000000;
                      local_3f8 = 0;
                      local_400 = 0;
                      lVar10 = 0;
                      do {
                        *(float *)((long)&local_400 + lVar10 * 4) =
                             (float)*(int *)(local_5b8 + lVar10 * 4);
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      local_3d8._M_string_length = local_3d8._M_string_length & 0xffffffff00000000;
                      local_3d8._M_dataplus._M_p = (pointer)0x0;
                      lVar10 = 0;
                      do {
                        fVar47 = *(float *)(paVar25 + lVar10 * 4);
                        fVar49 = *(float *)((long)&local_238._M_dataplus._M_p + lVar10 * 4);
                        fVar50 = *(float *)((long)&local_400 + lVar10 * 4);
                        if (fVar47 <= fVar50) {
                          fVar50 = fVar47;
                        }
                        uVar46 = -(uint)(fVar47 < fVar49);
                        *(uint *)((long)&local_3d8._M_dataplus._M_p + lVar10 * 4) =
                             uVar46 & (uint)fVar49 | ~uVar46 & (uint)fVar50;
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      operator<<((ostream *)local_3b0,(Vector<float,_3> *)&local_3d8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"\t\t\tReference native float max: ",0x1f);
                      local_160 = 0;
                      local_158 = 0;
                      local_418 = 0;
                      local_420 = 0;
                      lVar10 = 0;
                      do {
                        *(float *)((long)&local_420 + lVar10 * 4) =
                             (float)*(int *)(local_5b8 + lVar10 * 4);
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      local_410.m_data[2] = 0.0;
                      local_410.m_data[0] = 0.0;
                      local_410.m_data[1] = 0.0;
                      lVar10 = 0;
                      do {
                        fVar47 = *(float *)(paVar45 + lVar10 * 4);
                        fVar49 = *(float *)((long)&local_160 + lVar10 * 4);
                        fVar50 = *(float *)((long)&local_420 + lVar10 * 4);
                        if (fVar47 <= fVar50) {
                          fVar50 = fVar47;
                        }
                        uVar46 = -(uint)(fVar47 < fVar49);
                        local_410.m_data[lVar10] =
                             (float)(uVar46 & (uint)fVar49 | ~uVar46 & (uint)fVar50);
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      operator<<((ostream *)local_3b0,&local_410);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"\t\t\tFmin:\t",9);
                      local_170 = 0;
                      local_168 = 0;
                      local_180 = 0x3f8000003f800000;
                      local_178 = 0x3f800000;
                      local_430.m_data[2] = 0.0;
                      local_430.m_data[0] = 0.0;
                      local_430.m_data[1] = 0.0;
                      lVar10 = 0;
                      do {
                        fVar47 = *(float *)(paVar37 + lVar10 * 4);
                        fVar49 = *(float *)((long)&local_170 + lVar10 * 4);
                        fVar50 = *(float *)((long)&local_180 + lVar10 * 4);
                        if (fVar47 <= fVar50) {
                          fVar50 = fVar47;
                        }
                        uVar46 = -(uint)(fVar47 < fVar49);
                        local_430.m_data[lVar10] =
                             (float)(uVar46 & (uint)fVar49 | ~uVar46 & (uint)fVar50);
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      operator<<((ostream *)local_3b0,&local_430);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"\n",1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"\t\t\tFmax:\t",9);
                      local_190 = 0;
                      local_188 = 0;
                      local_1a0 = 0x3f8000003f800000;
                      local_198 = 0x3f800000;
                      local_440.m_data[2] = 0.0;
                      local_440.m_data[0] = 0.0;
                      local_440.m_data[1] = 0.0;
                      lVar10 = 0;
                      do {
                        fVar47 = *(float *)(paVar42 + lVar10 * 4);
                        fVar49 = *(float *)((long)&local_190 + lVar10 * 4);
                        fVar50 = *(float *)((long)&local_1a0 + lVar10 * 4);
                        if (fVar47 <= fVar50) {
                          fVar50 = fVar47;
                        }
                        uVar46 = -(uint)(fVar47 < fVar49);
                        local_440.m_data[lVar10] =
                             (float)(uVar46 & (uint)fVar49 | ~uVar46 & (uint)fVar50);
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      operator<<((ostream *)local_3b0,&local_440);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3b0,"\n",1);
                      local_5e0 = local_5e0 + 1;
                      paVar41 = paVar41 + 0x50;
                      paVar22 = paVar22 + 0x50;
                      paVar25 = paVar25 + 0x50;
                      paVar45 = paVar45 + 0x50;
                      paVar37 = paVar37 + 0x50;
                      paVar42 = paVar42 + 0x50;
                    } while (local_5e0 < *(int *)(local_558 + 4));
                  }
                  local_538 = local_538 + 1;
                  local_528 = local_528 + 0xf8;
                  local_478 = local_478 + 0xf8;
                  local_488 = local_488 + 0xf8;
                  local_498 = local_498 + 0xf8;
                  local_580 = local_580 + 0xf8;
                  local_588 = local_588 + 0xf8;
                } while (local_538 != (allocator_type *)(ulong)(uVar26 & 0x7fffffff));
              }
              MessageBuilder::operator<<
                        ((MessageBuilder *)local_3b8,(EndMessageToken *)&TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
              std::ios_base::~ios_base(local_340);
            }
LAB_019dcd71:
            if (local_5f0 != (allocator_type *)0x0) {
              operator_delete(local_5f0,(long)local_5d0 - (long)local_5f0);
            }
          }
          uVar19 = uVar19 + 1;
          iVar35 = surface->m_width;
          local_548 = (Surface *)(ulong)((int)local_548 + 1);
        } while ((int)uVar19 < iVar35 + -1);
        iVar20 = surface->m_height;
      }
      iVar43 = local_53c;
      uVar19 = (int)local_598 + 1;
      local_598 = (ulong)uVar19;
    } while ((int)uVar19 < iVar20 + -1);
    if (4 < local_5e4) {
      local_3b8 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"Omitted ",8);
      std::ostream::operator<<((ostringstream *)local_3b0,local_5e4 + -4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0," pixel error description(s).",0x1c);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_3b8,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
    }
    if (iVar43 == 0) goto LAB_019dd1e3;
    local_3b8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::ostream::operator<<((ostringstream *)local_3b0,iVar43);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0," invalid pixel(s) found.",0x18);
    MessageBuilder::operator<<((MessageBuilder *)local_3b8,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
    local_5b8 = (undefined1  [8])&local_5a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"Verification result","");
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"Result of rendering","");
    LogImageSet::LogImageSet((LogImageSet *)local_4f8,(string *)local_5b8,&local_578);
    TestLog::startImageSet(log,(char *)local_4f8,local_4d8._M_p);
    local_518.field_2._M_allocated_capacity._0_4_ = 0x75736552;
    local_518.field_2._M_allocated_capacity._4_2_ = 0x746c;
    local_518._M_string_length = 6;
    local_518.field_2._M_local_buf[6] = '\0';
    local_218.field_2._M_allocated_capacity._0_4_ = 0x75736552;
    local_218.field_2._M_allocated_capacity._4_2_ = 0x746c;
    local_218._M_string_length = 6;
    local_218.field_2._M_local_buf[6] = '\0';
    pSVar11 = surface;
    local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    LogImage::LogImage((LogImage *)local_3b8,&local_518,&local_218,surface,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_3b8,__fd,__buf,(size_t)pSVar11);
    local_3d8.field_2._M_allocated_capacity = 0x73614d726f727245;
    local_3d8.field_2._8_2_ = 0x6b;
    local_3d8._M_string_length = 9;
    local_238.field_2._M_allocated_capacity = 0x73614d726f727245;
    local_238.field_2._8_2_ = 0x6b;
    local_238._M_string_length = 9;
    pSVar11 = &local_468;
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    LogImage::LogImage((LogImage *)local_138,&local_3d8,&local_238,pSVar11,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_138,__fd,__buf_00,(size_t)pSVar11);
    TestLog::endImageSet(log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_p != local_108) {
      operator_delete(local_118._M_p,local_108[0]._M_allocated_capacity + 1);
    }
    if (local_138 != (undefined1  [8])&local_128) {
      operator_delete((void *)local_138,local_128._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_p != &local_388) {
      operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
    }
    if (local_3b8 != (undefined1  [8])((long)local_3b0 + 8)) {
      operator_delete((void *)local_3b8,(ulong)(local_3b0._8_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,
                      CONCAT17(local_218.field_2._M_local_buf[7],
                               CONCAT16(local_218.field_2._M_local_buf[6],
                                        CONCAT24(local_218.field_2._M_allocated_capacity._4_2_,
                                                 local_218.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,
                      CONCAT17(local_518.field_2._M_local_buf[7],
                               CONCAT16(local_518.field_2._M_local_buf[6],
                                        CONCAT24(local_518.field_2._M_allocated_capacity._4_2_,
                                                 local_518.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_p != &local_4c8) {
      operator_delete(local_4d8._M_p,local_4c8._M_allocated_capacity + 1);
    }
    if (local_4f8 != (undefined1  [8])&local_4e8) {
      operator_delete((void *)local_4f8,(ulong)(local_4e8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,
                      CONCAT17(local_578.field_2._M_local_buf[7],
                               CONCAT16(local_578.field_2._M_local_buf[6],
                                        CONCAT24(local_578.field_2._M_allocated_capacity._4_2_,
                                                 local_578.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if (local_5b8 != (undefined1  [8])&local_5a8) {
      operator_delete((void *)local_5b8,(ulong)(local_5a8._M_allocated_capacity + 1));
    }
    bVar9 = false;
  }
  TextureLevel::~TextureLevel(&local_80);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_150);
  if (local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_3f0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  Surface::~Surface(&local_468);
  if (bVar9) {
    return LINEINTERPOLATION_STRICTLY_CORRECT;
  }
LAB_019dd51d:
  local_3b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3b0,
             "Accurate verification failed, checking with projected weights (inaccurate equation).",
             0x54);
  MessageBuilder::operator<<((MessageBuilder *)local_3b8,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  bVar9 = anon_unknown_3::verifyLineGroupPixelIndependentInterpolation
                    (surface,scene,local_590,log,LINEINTERPOLATION_PROJECTED);
  return LINEINTERPOLATION_INCORRECT - bVar9;
}

Assistant:

LineInterpolationMethod verifyLineGroupInterpolation (const tcu::Surface& surface, const LineSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	const bool multisampled = args.numSamples != 0;

	if (multisampled)
	{
		if (verifyMultisampleLineGroupInterpolation(surface, scene, args, log))
			return LINEINTERPOLATION_STRICTLY_CORRECT;
		return LINEINTERPOLATION_INCORRECT;
	}
	else
	{
		const bool isNarrow = (scene.lineWidth == 1.0f);

		// accurate interpolation
		if (isNarrow)
		{
			if (verifySinglesampleNarrowLineGroupInterpolation(surface, scene, args, log))
				return LINEINTERPOLATION_STRICTLY_CORRECT;
		}
		else
		{
			if (verifySinglesampleWideLineGroupInterpolation(surface, scene, args, log))
				return LINEINTERPOLATION_STRICTLY_CORRECT;
		}

		// check with projected (inaccurate) interpolation
		log << tcu::TestLog::Message << "Accurate verification failed, checking with projected weights (inaccurate equation)." << tcu::TestLog::EndMessage;
		if (verifyLineGroupInterpolationWithProjectedWeights(surface, scene, args, log))
			return LINEINTERPOLATION_PROJECTED;

		return LINEINTERPOLATION_INCORRECT;
	}
}